

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void NavClampRectToVisibleAreaForMoveDir(ImGuiDir move_dir,ImRect *r,ImRect *clip_rect)

{
  float *in_RDX;
  float *in_RSI;
  int in_EDI;
  float fVar1;
  
  if ((in_EDI == 0) || (in_EDI == 1)) {
    fVar1 = ImClamp<float>(in_RSI[1],in_RDX[1],in_RDX[3]);
    in_RSI[1] = fVar1;
    fVar1 = ImClamp<float>(in_RSI[3],in_RDX[1],in_RDX[3]);
    in_RSI[3] = fVar1;
  }
  else {
    fVar1 = ImClamp<float>(*in_RSI,*in_RDX,in_RDX[2]);
    *in_RSI = fVar1;
    fVar1 = ImClamp<float>(in_RSI[2],*in_RDX,in_RDX[2]);
    in_RSI[2] = fVar1;
  }
  return;
}

Assistant:

static void inline NavClampRectToVisibleAreaForMoveDir(ImGuiDir move_dir, ImRect& r, const ImRect& clip_rect)
{
    if (move_dir == ImGuiDir_Left || move_dir == ImGuiDir_Right)
    {
        r.Min.y = ImClamp(r.Min.y, clip_rect.Min.y, clip_rect.Max.y);
        r.Max.y = ImClamp(r.Max.y, clip_rect.Min.y, clip_rect.Max.y);
    }
    else // FIXME: PageUp/PageDown are leaving move_dir == None
    {
        r.Min.x = ImClamp(r.Min.x, clip_rect.Min.x, clip_rect.Max.x);
        r.Max.x = ImClamp(r.Max.x, clip_rect.Min.x, clip_rect.Max.x);
    }
}